

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O3

QSslCertificate __thiscall QSslConfiguration::localCertificate(QSslConfiguration *this)

{
  long *in_RSI;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*in_RSI + 0x38) == 0) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    local_38.d.size = 0;
    QSslCertificate::QSslCertificate((QSslCertificate *)this,&local_38,Pem);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00245d6a;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00245d6a:
      __stack_chk_fail();
    }
    QSslCertificate::QSslCertificate((QSslCertificate *)this,*(QSslCertificate **)(*in_RSI + 0x30));
  }
  return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
         (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this;
}

Assistant:

QSslCertificate QSslConfiguration::localCertificate() const
{
    if (d->localCertificateChain.isEmpty())
        return QSslCertificate();
    return d->localCertificateChain[0];
}